

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting_settings.cpp
# Opt level: O3

void print_fitting_settings(fitting_settings *settings)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Current fitting settings: ",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tImage resolution:\t",0x13);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,settings->resolution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,settings->resolution);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tMinimum roughness:\t",0x14);
  poVar1 = std::ostream::_M_insert<double>((double)settings->min_roughness);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tMaximum roughness:\t",0x14);
  poVar1 = std::ostream::_M_insert<double>((double)settings->max_roughness);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tError est. samples:\t",0x15);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar1,settings->num_error_estimate_samples);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tLookup output file:\t",0x15);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(settings->output_file)._M_dataplus._M_p,
                      (settings->output_file)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void print_fitting_settings(const fitting_settings &settings)
{
  std::cout << "Current fitting settings: " << std::endl
    << "\tImage resolution:\t" << settings.resolution << "x"
    << settings.resolution << std::endl
    << "\tMinimum roughness:\t" << settings.min_roughness << std::endl
    << "\tMaximum roughness:\t" << settings.max_roughness << std::endl
    << "\tError est. samples:\t" << settings.num_error_estimate_samples
    << std::endl << "\tLookup output file:\t" << settings.output_file
    << std::endl;
}